

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbInternal.cpp
# Opt level: O2

void chatra::emb::writeRawInt
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,int64_t value)

{
  bool bVar1;
  ulong in_RAX;
  uchar *__args;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  uVar2 = value >> 0x3f ^ value;
  uStack_38 = in_RAX;
  if (value < 0 || 0x7f < uVar2) {
    do {
      uStack_38 = CONCAT17((char)uVar2,(undefined7)uStack_38) | 0x8000000000000000;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (buffer,(uchar *)((long)&uStack_38 + 7));
      uVar3 = uVar2 >> 7;
      bVar1 = 0x1fff < uVar2;
      uVar2 = uVar3;
    } while (bVar1);
    uVar2 = (ulong)((uint)uVar3 | (uint)((ulong)value >> 0x39) & 0xffffffc0);
    __args = (uchar *)((long)&uStack_38 + 6);
  }
  else {
    __args = (uchar *)((long)&uStack_38 + 5);
  }
  *__args = (uchar)uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,__args);
  return;
}

Assistant:

void writeRawInt(std::vector<uint8_t> &buffer, int64_t value) {
	int sign = (value >= 0 ? 1 : -1);
	auto t = (sign > 0 ? static_cast<uint64_t>(value) : static_cast<uint64_t>(~value));
	if (sign > 0 && t < 128) {
		buffer.emplace_back(static_cast<uint8_t>(t));
		return;
	}
	for (;;) {
		buffer.emplace_back(static_cast<uint8_t>((t & 0x7FU) | 0x80U));
		t >>= 7U;
		if (t < 64) {
			buffer.emplace_back(static_cast<uint8_t>(t | (sign > 0 ? 0U : 0x40U)));
			break;
		}
	}
}